

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall
c4::basic_substring<const_char>::begins_with_any(basic_substring<const_char> *this,ro_substr chars)

{
  size_t i;
  basic_substring<const_char> *this_local;
  ro_substr chars_local;
  
  if (this->len != 0) {
    for (i = 0; i < chars.len; i = i + 1) {
      if (*this->str == chars.str[i]) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool begins_with_any(ro_substr chars) const
    {
        if(len == 0)
        {
            return false;
        }
        for(size_t i = 0; i < chars.len; ++i)
        {
            if(str[0] == chars.str[i])
            {
                return true;
            }
        }
        return false;
    }